

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  Normal3f *n;
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  BilinearPatchMesh *mesh;
  int *piVar6;
  Point3f *pPVar7;
  undefined1 auVar8 [16];
  pbrt *this_00;
  optional<pbrt::ShapeSample> *this_01;
  bool bVar9;
  long lVar10;
  ShapeSample *pSVar11;
  Point3<float> *p2;
  Point3<float> *p2_00;
  Point3<float> *p2_01;
  Point3<float> *p;
  Float FVar12;
  type tVar13;
  undefined1 auVar14 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar15 [16];
  undefined1 extraout_var_06 [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  Point2f p_00;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var_03 [60];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined4 uVar65;
  undefined4 uVar66;
  uint uVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  Point3f PVar70;
  Vector3<float> VVar71;
  Vector3f a;
  Vector3f b;
  Vector3f c;
  Vector3f d;
  initializer_list<float> v;
  span<const_float> w_00;
  span<const_float> w_01;
  Tuple3<pbrt::Point3,_float> local_218;
  undefined4 local_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  Tuple3<pbrt::Vector3,_float> local_1e8;
  Point3f *local_1d8;
  undefined4 uStack_1d0;
  uint uStack_1cc;
  Point3<float> *local_1c0;
  pbrt *local_1b8;
  optional<pbrt::ShapeSample> *local_1b0;
  Float quadPDF;
  float local_1a0;
  Tuple3<pbrt::Vector3,_float> local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  uint uStack_10c;
  undefined1 local_108 [16];
  array<float,_4> w;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 auVar62 [56];
  
  local_188._8_8_ = local_188._0_8_;
  auVar16._8_56_ = in_register_00001208;
  auVar16._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  local_1f8._8_8_ = local_1f8._0_8_;
  local_1f8._0_8_ = this;
  local_208 = auVar16._0_16_;
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar10 = (long)this->blpIndex;
  piVar6 = mesh->vertexIndices;
  pPVar7 = mesh->p;
  iVar3 = piVar6[lVar10 * 4];
  iVar4 = piVar6[lVar10 * 4 + 1];
  iVar5 = piVar6[lVar10 * 4 + 2];
  local_1d8 = pPVar7 + piVar6[lVar10 * 4 + 3];
  local_1b0 = __return_storage_ptr__;
  PVar70 = ShapeSampleContext::p(ctx);
  local_218.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = in_register_00001208;
  local_218._0_8_ = vmovlps_avx(auVar17._0_16_);
  local_1c0 = pPVar7 + iVar3;
  VVar71 = Point3<float>::operator-(pPVar7 + iVar3,(Point3<float> *)&local_218);
  w.values[2] = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar18._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar18._0_16_);
  VVar71 = Normalize<float>((Vector3<float> *)&w);
  local_118 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar19._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = in_register_00001208;
  local_108 = auVar19._0_16_;
  PVar70 = ShapeSampleContext::p(ctx);
  local_218.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  auVar20._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar20._8_56_ = in_register_00001208;
  local_218._0_8_ = vmovlps_avx(auVar20._0_16_);
  local_188._0_8_ = pPVar7 + iVar4;
  VVar71 = Point3<float>::operator-(pPVar7 + iVar4,(Point3<float> *)&local_218);
  w.values[2] = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar21._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar21._0_16_);
  VVar71 = Normalize<float>((Vector3<float> *)&w);
  auVar22._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar22._8_56_ = in_register_00001208;
  local_128 = auVar22._0_16_;
  local_138._0_4_ = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  PVar70 = ShapeSampleContext::p(ctx);
  local_218.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  auVar23._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = in_register_00001208;
  local_218._0_8_ = vmovlps_avx(auVar23._0_16_);
  local_1b8 = (pbrt *)(pPVar7 + iVar5);
  VVar71 = Point3<float>::operator-((Point3<float> *)(pPVar7 + iVar5),(Point3<float> *)&local_218);
  w.values[2] = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar24._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar24._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar24._0_16_);
  VVar71 = Normalize<float>((Vector3<float> *)&w);
  local_158 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar25._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar25._8_56_ = in_register_00001208;
  local_148 = auVar25._0_16_;
  PVar70 = ShapeSampleContext::p(ctx);
  pPVar7 = local_1d8;
  local_218.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  auVar26._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar26._8_56_ = in_register_00001208;
  local_218._0_8_ = vmovlps_avx(auVar26._0_16_);
  VVar71 = Point3<float>::operator-(local_1d8,(Point3<float> *)&local_218);
  w.values[2] = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar27._0_16_);
  uVar2 = local_1f8._0_8_;
  VVar71 = Normalize<float>((Vector3<float> *)&w);
  auVar28._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar28._8_56_ = in_register_00001208;
  local_168 = auVar28._0_16_;
  local_178._0_4_ = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
  bVar9 = IsRectangle((BilinearPatch *)uVar2,mesh);
  auVar64 = local_108;
  auVar63 = local_128;
  auVar8 = local_148;
  auVar15 = local_168;
  if ((bVar9) && (mesh->imageDistribution == (PiecewiseConstant2D *)0x0)) {
    a.super_Tuple3<pbrt::Vector3,_float>.z = local_118;
    a.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_108._0_4_;
    a.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_108._4_4_;
    b.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_138._0_4_;
    b.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_128._0_4_;
    b.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_128._4_4_;
    c.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_178._0_4_;
    c.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_168._0_4_;
    c.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_168._4_4_;
    d.super_Tuple3<pbrt::Vector3,_float>.z = local_158;
    d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_148._0_4_;
    d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_148._4_4_;
    local_168 = auVar15;
    local_148 = auVar8;
    local_128 = auVar63;
    local_108 = auVar64;
    FVar12 = SphericalQuadArea(a,b,c,d);
    if (0.0001 < FVar12) {
      auVar62 = ZEXT456(0);
      local_1f8._0_8_ = mesh;
      if ((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x == 0.0) &&
          (fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y, fVar1 == 0.0)) && (!NAN(fVar1)))
      {
        fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
        auVar62 = (undefined1  [56])0x0;
        uVar65 = 0;
        uVar67 = 0;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          auVar29 = ZEXT464(0x3f800000);
          p = local_1c0;
          goto LAB_00246df5;
        }
      }
      uVar65 = 0;
      uVar67 = 0;
      n = &ctx->ns;
      PVar70 = ShapeSampleContext::p(ctx);
      p = local_1c0;
      local_198.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
      auVar35._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar35._8_56_ = auVar62;
      local_198._0_8_ = vmovlps_avx(auVar35._0_16_);
      VVar71 = Point3<float>::operator-(local_1c0,(Point3<float> *)&local_198);
      local_1a0 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar36._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar36._8_56_ = auVar62;
      _quadPDF = vmovlps_avx(auVar36._0_16_);
      VVar71 = Normalize<float>((Vector3<float> *)&quadPDF);
      local_1e8.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar37._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar37._8_56_ = auVar62;
      local_1e8._0_8_ = vmovlps_avx(auVar37._0_16_);
      auVar38._0_4_ = AbsDot<float>((Vector3<float> *)&local_1e8,n);
      auVar38._4_60_ = extraout_var;
      auVar15 = vmaxss_avx(auVar38._0_16_,ZEXT416(0x3c23d70a));
      auVar62 = ZEXT856(auVar15._8_8_);
      local_218.x = auVar15._0_4_;
      VVar71 = Point3<float>::operator-
                         ((Point3<float> *)local_188._0_8_,(Point3<float> *)&local_198);
      local_50.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar39._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar39._8_56_ = auVar62;
      local_50._0_8_ = vmovlps_avx(auVar39._0_16_);
      VVar71 = Normalize<float>((Vector3<float> *)&local_50);
      local_40.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar40._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar40._8_56_ = auVar62;
      local_40._0_8_ = vmovlps_avx(auVar40._0_16_);
      auVar41._0_4_ = AbsDot<float>((Vector3<float> *)&local_40,n);
      auVar41._4_60_ = extraout_var_00;
      auVar15 = vmaxss_avx(auVar41._0_16_,ZEXT416(0x3c23d70a));
      auVar62 = ZEXT856(auVar15._8_8_);
      local_218.y = auVar15._0_4_;
      VVar71 = Point3<float>::operator-((Point3<float> *)local_1b8,(Point3<float> *)&local_198);
      local_70.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar42._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar42._8_56_ = auVar62;
      local_70._0_8_ = vmovlps_avx(auVar42._0_16_);
      VVar71 = Normalize<float>((Vector3<float> *)&local_70);
      local_60.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar43._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar43._8_56_ = auVar62;
      local_60._0_8_ = vmovlps_avx(auVar43._0_16_);
      auVar44._0_4_ = AbsDot<float>((Vector3<float> *)&local_60,n);
      auVar44._4_60_ = extraout_var_01;
      auVar15 = vmaxss_avx(auVar44._0_16_,ZEXT416(0x3c23d70a));
      auVar62 = ZEXT856(auVar15._8_8_);
      local_218.z = auVar15._0_4_;
      VVar71 = Point3<float>::operator-(pPVar7,(Point3<float> *)&local_198);
      local_90.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar45._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar45._8_56_ = auVar62;
      local_90._0_8_ = vmovlps_avx(auVar45._0_16_);
      VVar71 = Normalize<float>((Vector3<float> *)&local_90);
      local_80.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar46._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar46._8_56_ = auVar62;
      local_80._0_8_ = vmovlps_avx(auVar46._0_16_);
      auVar47._0_4_ = AbsDot<float>((Vector3<float> *)&local_80,n);
      auVar47._4_60_ = extraout_var_02;
      auVar15 = vmaxss_avx(auVar47._0_16_,ZEXT416(0x3c23d70a));
      local_20c = auVar15._0_4_;
      v._M_len = 4;
      v._M_array = &local_218.x;
      pstd::array<float,_4>::array(&w,v);
      w_00.n = 4;
      w_00.ptr = w.values;
      p_00 = SampleBilinear((Point2f)local_208._0_8_,w_00);
      local_208._8_8_ = extraout_XMM0_Qb;
      local_208._0_4_ = p_00.super_Tuple2<pbrt::Point2,_float>.x;
      local_208._4_4_ = p_00.super_Tuple2<pbrt::Point2,_float>.y;
      w_01.n = 4;
      w_01.ptr = w.values;
      auVar29._0_4_ = BilinearPDF(p_00,w_01);
      auVar29._4_60_ = extraout_var_03;
LAB_00246df5:
      auVar62 = auVar29._8_56_;
      local_1d8 = (Point3f *)CONCAT44(local_1d8._4_4_,auVar29._0_4_);
      PVar70 = ShapeSampleContext::p(ctx);
      local_218.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
      auVar48._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar48._8_56_ = auVar62;
      uVar2 = local_188._0_8_;
      local_218._0_8_ = vmovlps_avx(auVar48._0_16_);
      VVar71 = Point3<float>::operator-((Point3<float> *)local_188._0_8_,p);
      this_00 = local_1b8;
      local_198.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar49._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar49._8_56_ = auVar62;
      local_198._0_8_ = vmovlps_avx(auVar49._0_16_);
      VVar71 = Point3<float>::operator-((Point3<float> *)local_1b8,p);
      local_1e8.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar50._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar50._8_56_ = auVar62;
      local_1e8._0_8_ = vmovlps_avx(auVar50._0_16_);
      auVar62 = ZEXT856((ulong)local_208._8_8_);
      PVar70 = SampleSphericalRectangle
                         ((Point3f *)&local_218,p,(Vector3f *)&local_198,(Vector3f *)&local_1e8,
                          (Point2f)local_208._0_8_,&quadPDF);
      w.values[2] = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
      auVar51._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar51._8_56_ = auVar62;
      w.values._0_8_ = vmovlps_avx(auVar51._0_16_);
      auVar62 = (undefined1  [56])0x0;
      local_208._0_4_ = local_1d8._0_4_ * quadPDF;
      VVar71 = Point3<float>::operator-((Point3<float> *)uVar2,p);
      local_198.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar52._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar52._8_56_ = auVar62;
      local_198._0_8_ = vmovlps_avx(auVar52._0_16_);
      VVar71 = Point3<float>::operator-((Point3<float> *)this_00,p);
      local_1e8.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar53._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar53._8_56_ = auVar62;
      local_1e8._0_8_ = vmovlps_avx(auVar53._0_16_);
      VVar71 = Cross<float>((Vector3<float> *)&local_198,(Vector3<float> *)&local_1e8);
      local_218.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar54._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar54._8_56_ = auVar62;
      local_218._0_8_ = vmovlps_avx(auVar54._0_16_);
      VVar71 = Normalize<float>((Vector3<float> *)&local_218);
      auVar55._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar55._8_56_ = auVar62;
      uStack_1cc = uVar67 ^ 0x80000000;
      bVar9 = *(char *)local_1f8._0_8_ == *(char *)(local_1f8._0_8_ + 1);
      if (!bVar9) {
        auVar55 = ZEXT1664(CONCAT412(auVar62._4_4_ ^ 0x80000000,
                                     CONCAT48(auVar62._0_4_ ^ 0x80000000,
                                              auVar55._0_8_ ^ 0x8000000080000000)));
      }
      auVar62 = auVar55._8_56_;
      local_1f8 = auVar55._0_16_;
      local_1d8 = (Point3f *)
                  (CONCAT44(uVar65,(uint)bVar9 * (int)VVar71.super_Tuple3<pbrt::Vector3,_float>.z +
                                   (uint)!bVar9 * (int)-VVar71.super_Tuple3<pbrt::Vector3,_float>.z)
                  ^ 0x8000000000000000);
      uStack_1d0 = 0x80000000;
      VVar71 = Point3<float>::operator-((Point3<float> *)&w,p);
      auVar56._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar56._8_56_ = auVar62;
      local_128 = auVar56._0_16_;
      local_108._4_4_ = uVar65;
      local_108._0_4_ = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      local_108._8_4_ = 0;
      local_108._12_4_ = uVar67;
      VVar71 = Point3<float>::operator-((Point3<float> *)uVar2,p);
      local_118 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar57._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar57._8_56_ = auVar62;
      local_148 = auVar57._0_16_;
      uStack_110 = 0;
      uStack_114 = uVar65;
      uStack_10c = uVar67;
      auVar58._0_4_ = DistanceSquared<float>((pbrt *)uVar2,p,p2_00);
      uVar66 = 0;
      auVar58._4_60_ = extraout_var_04;
      auVar62 = extraout_var_04._4_56_;
      local_138 = auVar58._0_16_;
      VVar71 = Point3<float>::operator-((Point3<float> *)&w,p);
      local_158 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar59._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar59._8_56_ = auVar62;
      local_178 = auVar59._0_16_;
      uStack_154 = uVar65;
      uStack_150 = uVar66;
      uStack_14c = uVar67;
      VVar71 = Point3<float>::operator-((Point3<float> *)this_00,p);
      auVar60._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar60._8_56_ = auVar62;
      local_188 = auVar60._0_16_;
      local_168._4_4_ = uVar65;
      local_168._0_4_ = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      local_168._8_4_ = 0;
      local_168._12_4_ = uVar67;
      auVar61._0_4_ = DistanceSquared<float>(this_00,p,p2_01);
      auVar61._4_60_ = extraout_var_05;
      auVar15 = vinsertps_avx(local_178,local_128,0x4c);
      auVar8 = vinsertps_avx(local_188,local_148,0x4c);
      auVar63._0_4_ = auVar15._0_4_ * auVar8._0_4_;
      auVar63._4_4_ = auVar15._4_4_ * auVar8._4_4_;
      auVar63._8_4_ = auVar15._8_4_ * auVar8._8_4_;
      auVar63._12_4_ = auVar15._12_4_ * auVar8._12_4_;
      auVar15 = vinsertps_avx(local_128,local_178,0x1c);
      auVar8 = vinsertps_avx(local_148,local_188,0x1c);
      auVar63 = vfmadd213ps_fma(auVar8,auVar15,auVar63);
      auVar8._4_4_ = uStack_114;
      auVar8._0_4_ = local_118;
      auVar8._8_4_ = uStack_110;
      auVar8._12_4_ = uStack_10c;
      auVar15 = vinsertps_avx(local_108,ZEXT416((uint)local_158),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)local_168._0_4_),0x10);
      auVar8 = vfmadd213ps_fma(auVar8,auVar15,auVar63);
      auVar69._4_4_ = w.values[1];
      auVar69._0_4_ = w.values[1];
      auVar69._8_4_ = w.values[1];
      auVar69._12_4_ = w.values[1];
      auVar15 = vinsertps_avx(local_138,auVar61._0_16_,0x10);
      auVar64._4_4_ = w.values[0];
      auVar64._0_4_ = w.values[0];
      auVar64._8_4_ = w.values[0];
      auVar64._12_4_ = w.values[0];
      auVar15 = vdivps_avx(auVar8,auVar15);
      auVar68._4_4_ = w.values[2];
      auVar68._0_4_ = w.values[2];
      auVar68._8_4_ = w.values[2];
      auVar68._12_4_ = w.values[2];
      auVar8 = vmovlhps_avx(auVar64,auVar69);
      FVar12 = ctx->time;
      local_1b0->set = true;
      *(undefined1 (*) [16])&local_1b0->optionalValue = auVar8;
      uVar2 = vmovlps_avx(auVar68);
      *(undefined8 *)((long)&local_1b0->optionalValue + 0x10) = uVar2;
      *(Float *)((long)&local_1b0->optionalValue + 0x18) = FVar12;
      *(undefined8 *)((long)&local_1b0->optionalValue + 0x1c) = 0;
      *(undefined4 *)((long)&local_1b0->optionalValue + 0x24) = 0;
      uVar2 = vmovlps_avx(local_1f8);
      *(undefined8 *)((long)&local_1b0->optionalValue + 0x28) = uVar2;
      *(float *)((long)&local_1b0->optionalValue + 0x30) = local_1d8._0_4_;
      uVar2 = vmovlps_avx(auVar15);
      *(undefined8 *)((long)&local_1b0->optionalValue + 0x34) = uVar2;
      *(undefined1 (*) [16])((long)&local_1b0->optionalValue + 0x40) = ZEXT816(0) << 0x20;
      *(undefined4 *)((long)&local_1b0->optionalValue + 0x50) = local_208._0_4_;
      return local_1b0;
    }
  }
  Sample((optional<pbrt::ShapeSample> *)&w,(BilinearPatch *)uVar2,(Point2f)local_208._0_8_);
  local_208._0_4_ = ctx->time;
  pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
  auVar62 = (undefined1  [56])0x0;
  (pSVar11->intr).time = (Float)local_208._0_4_;
  pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
  this_01 = local_1b0;
  PVar70 = Interaction::p(&pSVar11->intr);
  auVar30._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar30._8_56_ = auVar62;
  local_208 = auVar30._0_16_;
  local_1f8._0_4_ = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  PVar70 = ShapeSampleContext::p(ctx);
  auVar31._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = auVar62;
  auVar15 = vsubps_avx(local_208,auVar31._0_16_);
  local_218.z = (float)local_1f8._0_4_ - PVar70.super_Tuple3<pbrt::Point3,_float>.z;
  local_218._0_8_ = vmovlps_avx(auVar15);
  auVar14._0_4_ = auVar15._0_4_ * auVar15._0_4_;
  auVar14._4_4_ = auVar15._4_4_ * auVar15._4_4_;
  auVar14._8_4_ = auVar15._8_4_ * auVar15._8_4_;
  auVar14._12_4_ = auVar15._12_4_ * auVar15._12_4_;
  auVar15 = vhaddps_avx(auVar14,auVar14);
  fVar1 = local_218.z * local_218.z + auVar15._0_4_;
  auVar62 = (undefined1  [56])0x0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    VVar71 = Normalize<float>((Vector3<float> *)&local_218);
    local_218.z = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar32._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar32._8_56_ = auVar62;
    local_218._0_8_ = vmovlps_avx(auVar32._0_16_);
    pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    auVar15._0_8_ = local_218._0_8_ ^ 0x8000000080000000;
    auVar15._8_4_ = 0x80000000;
    auVar15._12_4_ = 0x80000000;
    local_198.z = -local_218.z;
    local_198._0_8_ = vmovlps_avx(auVar15);
    tVar13 = AbsDot<float>(&(pSVar11->intr).n,(Vector3<float> *)&local_198);
    local_208._0_4_ = tVar13;
    auVar62 = extraout_var_06;
    PVar70 = ShapeSampleContext::p(ctx);
    local_1e8.z = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
    auVar33._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar33._8_56_ = auVar62;
    local_1e8._0_8_ = vmovlps_avx(auVar33._0_16_);
    pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    PVar70 = Interaction::p(&pSVar11->intr);
    local_1a0 = PVar70.super_Tuple3<pbrt::Point3,_float>.z;
    auVar34._0_8_ = PVar70.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar34._8_56_ = auVar62;
    _quadPDF = vmovlps_avx(auVar34._0_16_);
    local_1f8._0_4_ = DistanceSquared<float>((pbrt *)&local_1e8,(Point3<float> *)&quadPDF,p2);
    pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    pSVar11->pdf = pSVar11->pdf / ((float)local_208._0_4_ / (float)local_1f8._0_4_);
    pSVar11 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    if (ABS(pSVar11->pdf) != INFINITY) {
      pstd::optional<pbrt::ShapeSample>::optional(this_01,(optional<pbrt::ShapeSample> *)&w);
      goto LAB_00246c3c;
    }
  }
  *(undefined8 *)((long)&this_01->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x50) = 0;
  *(undefined8 *)&this_01->set = 0;
  (this_01->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&this_01->optionalValue + 8) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&this_01->optionalValue + 0x38) = 0;
LAB_00246c3c:
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)&w);
  return this_01;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle(mesh) && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}